

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_sync_decoder_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::PriceSyncDecoderTest::PriceSyncDecoderTest
          (PriceSyncDecoderTest *this)

{
  ExtendableDataDictionary *this_00;
  allocator<char> local_161;
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  FieldDef local_e0 [8];
  string local_d8 [40];
  FieldDef local_b0 [8];
  string local_a8 [40];
  FieldDef local_80 [8];
  string local_78 [40];
  FieldDef local_50 [8];
  string local_48 [40];
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__PriceSyncDecoderTest_002716a0;
  bidfx_public_api::price::pixie::PriceSyncDecoder::PriceSyncDecoder(&this->decoder);
  this_00 = &this->data_dictionary;
  ExtendableDataDictionary::ExtendableDataDictionary(this_00);
  std::__cxx11::string::string<std::allocator<char>>(local_100,"Bid",&local_161);
  bidfx_public_api::price::pixie::FieldDef::FieldDef(local_50,0,0x44,local_100);
  bidfx_public_api::price::pixie::ExtendableDataDictionary::AddFieldDef(this_00,local_50);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::string<std::allocator<char>>(local_120,"BidSize",&local_161);
  bidfx_public_api::price::pixie::FieldDef::FieldDef(local_80,1,0x4c,local_120);
  bidfx_public_api::price::pixie::ExtendableDataDictionary::AddFieldDef(this_00,local_80);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::string<std::allocator<char>>(local_140,"Ask",&local_161);
  bidfx_public_api::price::pixie::FieldDef::FieldDef(local_b0,2,0x44,local_140);
  bidfx_public_api::price::pixie::ExtendableDataDictionary::AddFieldDef(this_00,local_b0);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::string<std::allocator<char>>(local_160,"AskSize",&local_161);
  bidfx_public_api::price::pixie::FieldDef::FieldDef(local_e0,3,0x4c,local_160);
  bidfx_public_api::price::pixie::ExtendableDataDictionary::AddFieldDef(this_00,local_e0);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_160);
  return;
}

Assistant:

PriceSyncDecoderTest()
    {
        data_dictionary.AddFieldDef(FieldDef(0, FieldTypeEnum::DOUBLE, "Bid"));
        data_dictionary.AddFieldDef(FieldDef(1, FieldTypeEnum::LONG, "BidSize"));
        data_dictionary.AddFieldDef(FieldDef(2, FieldTypeEnum::DOUBLE, "Ask"));
        data_dictionary.AddFieldDef(FieldDef(3, FieldTypeEnum::LONG, "AskSize"));
    }